

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

StringPtr capnp::compiler::getExpressionTargetName(Reader exp)

{
  ArrayPtr<const_char> AVar1;
  Reader exp_00;
  ArrayPtr<const_char> AVar2;
  Reader local_98;
  Reader local_68;
  Reader local_38;
  
  AVar2.size_ = 1;
  AVar2.ptr = "";
  AVar1.size_ = 1;
  AVar1.ptr = "";
  if (exp._reader.dataSize < 0x10) {
    return (StringPtr)AVar1;
  }
  local_98._reader._32_8_ = exp._reader._32_8_;
  switch(*exp._reader.data) {
  case 5:
    Expression::Reader::getRelativeName(&local_98,&exp);
    break;
  default:
    goto switchD_001830ea_caseD_6;
  case 9:
    local_98._reader.nestingLimit = exp._reader.nestingLimit;
    local_98._reader._44_4_ = exp._reader._44_4_;
    local_98._reader.data = exp._reader.data;
    local_98._reader.pointers = exp._reader.pointers;
    local_98._reader.segment = exp._reader.segment;
    local_98._reader.capTable = exp._reader.capTable;
    Expression::Application::Reader::getFunction(&local_38,(Reader *)&local_98);
    exp_00._reader.capTable = local_38._reader.capTable;
    exp_00._reader.segment = local_38._reader.segment;
    exp_00._reader.data = local_38._reader.data;
    exp_00._reader.pointers = local_38._reader.pointers;
    exp_00._reader.dataSize = local_38._reader.dataSize;
    exp_00._reader.pointerCount = local_38._reader.pointerCount;
    exp_00._reader._38_2_ = local_38._reader._38_2_;
    exp_00._reader.nestingLimit = local_38._reader.nestingLimit;
    exp_00._reader._44_4_ = local_38._reader._44_4_;
    AVar2 = (ArrayPtr<const_char>)getExpressionTargetName(exp_00);
    return (StringPtr)AVar2;
  case 10:
    local_68._reader.nestingLimit = exp._reader.nestingLimit;
    local_68._reader._44_4_ = exp._reader._44_4_;
    local_68._reader.data = exp._reader.data;
    local_68._reader.pointers = exp._reader.pointers;
    local_68._reader.segment = exp._reader.segment;
    local_68._reader.capTable = exp._reader.capTable;
    local_68._reader._32_8_ = local_98._reader._32_8_;
    Expression::Member::Reader::getName(&local_98,&local_68);
    break;
  case 0xb:
    Expression::Reader::getAbsoluteName(&local_98,&exp);
  }
  AVar2 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_98);
switchD_001830ea_caseD_6:
  return (StringPtr)AVar2;
}

Assistant:

static kj::StringPtr getExpressionTargetName(Expression::Reader exp) {
  kj::StringPtr targetName;
  switch (exp.which()) {
    case Expression::ABSOLUTE_NAME:
      return exp.getAbsoluteName().getValue();
    case Expression::RELATIVE_NAME:
      return exp.getRelativeName().getValue();
    case Expression::APPLICATION:
      return getExpressionTargetName(exp.getApplication().getFunction());
    case Expression::MEMBER:
      return exp.getMember().getName().getValue();
    default:
      return nullptr;
  }
}